

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * bc_str_lstrip(char *str)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (str == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    sVar2 = 0;
    do {
      if (sVar1 == sVar2) {
        return str;
      }
      if ((0x20 < (ulong)(byte)str[sVar2]) ||
         ((0x100003e00U >> ((ulong)(byte)str[sVar2] & 0x3f) & 1) == 0)) {
        return str + sVar2;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    pcVar3 = str + sVar1;
  }
  return pcVar3;
}

Assistant:

char*
bc_str_lstrip(char *str)
{
    if (str == NULL)
        return NULL;
    int i;
    size_t str_len = strlen(str);
    for (i = 0; i < str_len; i++) {
        if ((str[i] != ' ') && (str[i] != '\t') && (str[i] != '\n') &&
            (str[i] != '\r') && (str[i] != '\t') && (str[i] != '\f') &&
            (str[i] != '\v'))
        {
            str += i;
            break;
        }
        if (i == str_len - 1) {
            str += str_len;
            break;
        }
    }
    return str;
}